

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordManager.cpp
# Opt level: O3

set<Addr,_std::less<Addr>,_std::allocator<Addr>_> * __thiscall
RecordManager::FindSuchRecord
          (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *__return_storage_ptr__,
          RecordManager *this,STMT *S,set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *ps)

{
  _Rb_tree_header *p_Var1;
  Addr p;
  long lVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  ulong uVar6;
  _Base_ptr p_Var7;
  long *plVar8;
  pointer pcVar9;
  ulong uVar10;
  _Self __tmp;
  long lVar11;
  string filename;
  Record R;
  long *local_170;
  long local_160;
  long lStack_158;
  _Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>> *local_150;
  RecordSet *local_148;
  STMT *local_140;
  _Rb_tree_node_base *local_138;
  key_type local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_f0 [8];
  _Alloc_hider local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined8 local_c8;
  int local_c0;
  int local_b8;
  _Alloc_hider local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined8 local_90;
  Record local_88;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_150 = (_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>> *)
              __return_storage_ptr__;
  Record::Record(&local_88);
  std::operator+(&local_110,&this->Direction,&S->tableName);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
  local_170 = &local_160;
  plVar8 = plVar5 + 2;
  if ((long *)*plVar5 == plVar8) {
    local_160 = *plVar8;
    lStack_158 = plVar5[3];
  }
  else {
    local_160 = *plVar8;
    local_170 = (long *)*plVar5;
  }
  lVar11 = plVar5[1];
  *plVar5 = (long)plVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_130,local_170,lVar11 + (long)local_170)
  ;
  local_148 = (RecordSet *)
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RecordSet>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RecordSet>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RecordSet>_>_>
              ::find(&(this->Total_Record)._M_t,&local_130);
  local_140 = S;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  p_Var7 = (ps->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_138 = &(ps->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var7 != local_138) {
    local_148 = (RecordSet *)&local_148->TypeTable;
    do {
      p.BlockNum = p_Var7[1]._M_color;
      p.FileOff = *(int *)&p_Var7[1].field_0x4;
      iVar4 = RecordSet::FindRecord(local_148,p,&local_88);
      if (iVar4 == 1) {
        pcVar9 = (local_140->c_list->super__Vector_base<condition,_std::allocator<condition>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        if ((local_140->c_list->super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
            super__Vector_impl_data._M_finish != pcVar9) {
          lVar11 = 0;
          uVar10 = 0;
          do {
            local_f0._0_4_ = *(int *)((long)&pcVar9->colunmID + lVar11);
            local_e8._M_p = (pointer)&local_d8;
            lVar2 = *(long *)((long)&(pcVar9->colunmName)._M_dataplus._M_p + lVar11);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e8,lVar2,
                       *(long *)((long)&(pcVar9->colunmName)._M_string_length + lVar11) + lVar2);
            local_c0 = *(int *)((long)&pcVar9->op + lVar11);
            local_c8 = *(undefined8 *)(&pcVar9->isIndex + lVar11);
            local_b8 = *(int *)((long)&(pcVar9->key).type + lVar11);
            lVar2 = *(long *)((long)&(pcVar9->key).charV._M_dataplus._M_p + lVar11);
            local_b0._M_p = (pointer)&local_a0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,lVar2,
                       *(long *)((long)&(pcVar9->key).charV._M_string_length + lVar11) + lVar2);
            local_90 = *(undefined8 *)((long)&(pcVar9->key).intV + lVar11);
            bVar3 = Record::Check(&local_88,(condition *)local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_p != &local_a0) {
              operator_delete(local_b0._M_p,local_a0._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_p != &local_d8) {
              operator_delete(local_e8._M_p,local_d8._M_allocated_capacity + 1);
            }
            if (!bVar3) goto LAB_001222e0;
            uVar10 = uVar10 + 1;
            pcVar9 = (local_140->c_list->super__Vector_base<condition,_std::allocator<condition>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            uVar6 = ((long)(local_140->c_list->
                           super__Vector_base<condition,_std::allocator<condition>_>)._M_impl.
                           super__Vector_impl_data._M_finish - (long)pcVar9 >> 3) *
                    0x4ec4ec4ec4ec4ec5;
            lVar11 = lVar11 + 0x68;
          } while (uVar10 <= uVar6 && uVar6 - uVar10 != 0);
        }
        std::_Rb_tree<Addr,Addr,std::_Identity<Addr>,std::less<Addr>,std::allocator<Addr>>::
        _M_insert_unique<Addr_const&>(local_150,(Addr *)(p_Var7 + 1));
      }
LAB_001222e0:
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != local_138);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,local_160 + 1);
  }
  std::vector<Keys,_std::allocator<Keys>_>::~vector(&local_88.KS);
  if (local_88.KF.super__Vector_base<Keyf,_std::allocator<Keyf>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.KF.super__Vector_base<Keyf,_std::allocator<Keyf>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.KF.super__Vector_base<Keyf,_std::allocator<Keyf>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.KF.super__Vector_base<Keyf,_std::allocator<Keyf>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_88.KI.super__Vector_base<Keyi,_std::allocator<Keyi>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.KI.super__Vector_base<Keyi,_std::allocator<Keyi>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.KI.super__Vector_base<Keyi,_std::allocator<Keyi>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.KI.super__Vector_base<Keyi,_std::allocator<Keyi>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return (set<Addr,_std::less<Addr>,_std::allocator<Addr>_> *)local_150;
}

Assistant:

set<Addr> RecordManager::FindSuchRecord(STMT S, set<Addr>ps) {
	set<Addr> ans;
	set<Addr>::iterator it;
	Record R;
	string filename = Direction + S.tableName + "_rcd.dat";
	RecordSet& RS = this->FindRecordSet(filename);
	for (it = ps.begin(); it != ps.end(); it++) {
		int Found = RS.FindRecord(*it, R);
		if (Found != 1)
			continue;				//�õ�ַ�ϵļ�¼��Ч��ֱ�Ӽ����һ��
		else {
			bool flag = true;
			int i;
			for (i = 0; i < S.c_list->size(); i++) {
				if (R.Check(S.c_list->at(i)) == false) {
					flag = false;	//����һ�����������㣬ֱ����̭
					break;
				}
			}
			if (flag == true) {
				ans.insert(*it);		//�������������ģ������ַ������������
			}
		}
	}
	return ans;
}